

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train.c
# Opt level: O0

char * readline(FILE *input)

{
  char *pcVar1;
  size_t sVar2;
  int len;
  FILE *input_local;
  
  pcVar1 = fgets(line,max_line_len,(FILE *)input);
  if (pcVar1 == (char *)0x0) {
    input_local = (FILE *)0x0;
  }
  else {
    do {
      pcVar1 = strrchr(line,10);
      if (pcVar1 != (char *)0x0) break;
      max_line_len = max_line_len << 1;
      line = (char *)realloc(line,(long)max_line_len);
      sVar2 = strlen(line);
      pcVar1 = fgets(line + (int)sVar2,max_line_len - (int)sVar2,(FILE *)input);
    } while (pcVar1 != (char *)0x0);
    input_local = (FILE *)line;
  }
  return (char *)input_local;
}

Assistant:

static char* readline(FILE *input)
{
	int len;

	if(fgets(line,max_line_len,input) == NULL)
		return NULL;

	while(strrchr(line,'\n') == NULL)
	{
		max_line_len *= 2;
		line = (char *) realloc(line,max_line_len);
		len = (int) strlen(line);
		if(fgets(line+len,max_line_len-len,input) == NULL)
			break;
	}
	return line;
}